

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDifference.cpp
# Opt level: O3

void __thiscall
OpenMD::CountDifference::CountDifference
          (CountDifference *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  long *plVar1;
  long *plVar2;
  long *local_58;
  long local_48;
  long lStack_40;
  string local_38;
  
  SequentialAnalyzer::SequentialAnalyzer(&this->super_SequentialAnalyzer,info,filename,sele1,sele2);
  (this->super_SequentialAnalyzer)._vptr_SequentialAnalyzer =
       (_func_int **)&PTR__CountDifference_0024d8b0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getPrefix(&local_38,filename);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_48 = *plVar2;
    lStack_40 = plVar1[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar2;
    local_58 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).outputFilename_);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

CountDifference::CountDifference(SimInfo* info,
				   const std::string& filename,
				   const std::string& sele1,
				   const std::string& sele2) :
    SequentialAnalyzer(info, filename, sele1, sele2) {
    setOutputName(getPrefix(filename) + ".DeltaC");
  }